

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regreftest.cc
# Opt level: O0

void __thiscall
lf::refinement::test::LocRefTest_AffMeshRef_Test::TestBody(LocRefTest_AffMeshRef_Test *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  element_type *mesh_00;
  pointer psVar4;
  undefined4 extraout_var;
  reference ppEVar5;
  undefined4 extraout_var_00;
  Message *pMVar6;
  char *pcVar7;
  char *in_R9;
  double dVar8;
  AssertHelper local_438;
  Message local_430;
  undefined1 local_428 [8];
  AssertionResult gtest_ar;
  AssertHelper local_3f8;
  Message local_3f0;
  bool local_3e1;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_309;
  string local_308;
  stringstream local_2e8 [8];
  stringstream ss;
  ostream local_2d8 [376];
  Geometry *local_160;
  Geometry *geo_ptr;
  Entity *cell;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  double dom_vol;
  pointer local_110;
  Mesh *mesh;
  int l;
  size_type n_levels;
  undefined1 local_f8 [8];
  MeshHierarchy multi_mesh;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_38;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  mesh_factory_ptr;
  undefined1 local_20 [8];
  shared_ptr<lf::mesh::Mesh> mesh_p;
  LocRefTest_AffMeshRef_Test *this_local;
  
  mesh_p.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  poVar3 = std::operator<<((ostream *)&std::cout,"TEST: Refinement of an affine mesh");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  lf::mesh::test_utils::GenerateHybrid2DTestMesh((test_utils *)local_20,5,1.0);
  mesh_00 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  lf::mesh::utils::PrintInfo((ostream *)&std::cout,mesh_00,0xb);
  multi_mesh.refinement_edges_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
  std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>((int *)&local_38);
  std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>,void>
            ((unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>> *)&l,
             &local_38);
  MeshHierarchy::MeshHierarchy
            ((MeshHierarchy *)local_f8,(shared_ptr<lf::mesh::Mesh> *)local_20,
             (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)&l);
  std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::~unique_ptr
            ((unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)&l);
  refine_for_testing((MeshHierarchy *)local_f8);
  mesh._4_4_ = MeshHierarchy::NumLevels((MeshHierarchy *)local_f8);
  mesh._0_4_ = 0;
  do {
    if (mesh._4_4_ <= (uint)mesh) {
      MeshHierarchy::~MeshHierarchy((MeshHierarchy *)local_f8);
      std::
      unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
      ::~unique_ptr(&local_38);
      std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)local_20);
      return;
    }
    MeshHierarchy::getMesh((MeshHierarchy *)&dom_vol,(size_type)local_f8);
    psVar4 = (pointer)std::
                      __shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&dom_vol);
    std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)&dom_vol);
    __range3 = (span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)0x0;
    local_110 = psVar4;
    iVar2 = (*(code *)(psVar4->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[2]._vptr_Mesh)(psVar4,0);
    __begin3._M_current = (Entity **)CONCAT44(extraout_var,iVar2);
    __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
    cell = (Entity *)
           std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
    while (bVar1 = __gnu_cxx::
                   operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                             (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                       *)&cell), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppEVar5 = __gnu_cxx::
                __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                ::operator*(&__end3);
      geo_ptr = (Geometry *)*ppEVar5;
      iVar2 = (*((Entity *)geo_ptr)->_vptr_Entity[3])();
      local_160 = (Geometry *)CONCAT44(extraout_var_00,iVar2);
      if (local_160 == (Geometry *)0x0) {
        std::__cxx11::stringstream::stringstream(local_2e8);
        poVar3 = std::operator<<(local_2d8,"No geometry for cell ");
        lf::mesh::operator<<(poVar3,(Entity *)geo_ptr);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_308,"geo_ptr != nullptr",&local_309);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_330,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/regreftest.cc"
                   ,&local_331);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_308,&local_330,0x1e7,&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_330);
        std::allocator<char>::~allocator(&local_331);
        std::__cxx11::string::~string((string *)&local_308);
        std::allocator<char>::~allocator(&local_309);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"false",&local_379);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/regreftest.cc"
                   ,&local_3a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"",
                   (allocator<char> *)
                   ((long)&gtest_ar_.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 7));
        lf::base::AssertionFailed(&local_378,&local_3a0,0x1e7,&local_3c8);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&gtest_ar_.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 7));
        std::__cxx11::string::~string((string *)&local_3a0);
        std::allocator<char>::~allocator(&local_3a1);
        std::__cxx11::string::~string((string *)&local_378);
        std::allocator<char>::~allocator(&local_379);
        abort();
      }
      iVar2 = (*local_160->_vptr_Geometry[9])();
      local_3e1 = (bool)((byte)iVar2 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_3e0,&local_3e1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
      if (!bVar1) {
        testing::Message::Message(&local_3f0);
        pMVar6 = testing::Message::operator<<(&local_3f0,(char (*) [7])"Level ");
        pMVar6 = testing::Message::operator<<(pMVar6,(int *)&mesh);
        pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [8])", cell ");
        pMVar6 = testing::Message::operator<<(pMVar6,(Entity *)geo_ptr);
        pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [13])" not affine!");
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_3e0,
                   (AssertionResult *)"geo_ptr->isAffine()","false","true",in_R9);
        pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &gtest_ar.message_);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/regreftest.cc"
                   ,0x1e8,pcVar7);
        testing::internal::AssertHelper::operator=(&local_3f8,pMVar6);
        testing::internal::AssertHelper::~AssertHelper(&local_3f8);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_3f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
      dVar8 = lf::geometry::Volume(local_160);
      __range3 = (span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                 (dVar8 + (double)__range3);
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end3);
    }
    testing::internal::DoubleNearPredFormat
              ((internal *)local_428,"dom_vol","9.0","1.0E-4",(double)__range3,9.0,0.0001);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
    if (!bVar1) {
      testing::Message::Message(&local_430);
      pMVar6 = testing::Message::operator<<(&local_430,(char (*) [16])" Domain volume ");
      pMVar6 = testing::Message::operator<<(pMVar6,(double *)&__range3);
      pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [8])" != 9.0");
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
      testing::internal::AssertHelper::AssertHelper
                (&local_438,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/regreftest.cc"
                 ,0x1ec,pcVar7);
      testing::internal::AssertHelper::operator=(&local_438,pMVar6);
      testing::internal::AssertHelper::~AssertHelper(&local_438);
      testing::Message::~Message(&local_430);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
    mesh._0_4_ = (uint)mesh + 1;
  } while( true );
}

Assistant:

TEST(LocRefTest, AffMeshRef) {
  std::cout << "TEST: Refinement of an affine mesh" << std::endl;
  // Generate an hybriod mesh of [0,3]^2, comprising only affine cells
  // (selector = 5)
  auto mesh_p = lf::mesh::test_utils::GenerateHybrid2DTestMesh(5);
  // Output mesh information
  lf::mesh::utils::PrintInfo(std::cout, *mesh_p);

  // Build mesh hierarchy
  std::unique_ptr<lf::mesh::hybrid2d::MeshFactory> mesh_factory_ptr =
      std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2);
  lf::refinement::MeshHierarchy multi_mesh(mesh_p, std::move(mesh_factory_ptr));

  // Several step of refinement
  refine_for_testing(multi_mesh);

  // Check mesh integrity
  const size_type n_levels = multi_mesh.NumLevels();
  for (int l = 0; l < n_levels; ++l) {
    // Verify that all cells are still affine
    const lf::mesh::Mesh &mesh{*multi_mesh.getMesh(l)};
    // Loop over all cells
    double dom_vol = 0.0;
    for (const lf::mesh::Entity *cell : mesh.Entities(0)) {
      const lf::geometry::Geometry *geo_ptr{cell->Geometry()};
      LF_ASSERT_MSG(geo_ptr != nullptr, "No geometry for cell " << *cell);
      EXPECT_TRUE(geo_ptr->isAffine())
          << "Level " << l << ", cell " << *cell << " not affine!";
      dom_vol += lf::geometry::Volume(*geo_ptr);
    }
    EXPECT_NEAR(dom_vol, 9.0, 1.0E-4)
        << " Domain volume " << dom_vol << " != 9.0";
  }
}